

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_0::CWriter::WriteMemory(CWriter *this,string *name,Memory *memory)

{
  string local_40;
  Memory *local_20;
  Memory *memory_local;
  string *name_local;
  CWriter *this_local;
  
  local_20 = memory;
  memory_local = (Memory *)name;
  name_local = (string *)this;
  (anonymous_namespace)::GetMemoryTypeString_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)memory,memory);
  (anonymous_namespace)::CWriter::
  Write<std::__cxx11::string,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[2]>
            ((CWriter *)this,&local_40,(char (*) [2])0x36dfa4,&memory_local->name,
             (char (*) [2])0x37ca1e);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void CWriter::WriteMemory(const std::string& name, const Memory& memory) {
  Write(GetMemoryTypeString(memory), " ", name, ";");
}